

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type)

{
  bool bVar1;
  uint uVar2;
  SPIRType *pSVar3;
  string expr;
  string cast_op1;
  string cast_op0;
  SPIRType expected_type;
  undefined4 in_stack_fffffffffffffde4;
  string local_218;
  char *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  uVar2 = (uint)skip_cast_if_equal_type;
  local_1f8 = op;
  binary_op_bitcast_helper
            ((SPIRType *)local_190,this,&local_1b0,&local_1d0,&input_type,op0,op1,
             skip_cast_if_equal_type);
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  if (pSVar3->basetype == Boolean || pSVar3->basetype == input_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_218,(spirv_cross *)&local_1f8,(char **)0x398789,(char (*) [2])&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
               (char (*) [3])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffde4,uVar2));
    ::std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
  }
  else {
    local_190._16_4_ = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(&local_218,this,pSVar3);
    ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1f0);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_218,(spirv_cross *)&local_1f8,(char **)0x398789,(char (*) [2])&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
               (char (*) [3])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a4196,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffde4,uVar2));
    ::std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1f0);
  }
  bVar1 = should_forward(this,op0);
  if (bVar1) {
    bVar1 = should_forward(this,op1);
  }
  else {
    bVar1 = false;
  }
  emit_op(this,result_type,result_id,&local_1f0,bVar1,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_190._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                            const char *op, SPIRType::BaseType input_type, bool skip_cast_if_equal_type)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	string expr;
	if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}